

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

int __thiscall MeshLib::List<MeshLib::Vertex>::remove(List<MeshLib::Vertex> *this,char *__filename)

{
  ListNode<MeshLib::Vertex> **ppLVar1;
  ListNode<MeshLib::Vertex> *extraout_RAX;
  ListNode<MeshLib::Vertex> *pLVar2;
  ListNode<MeshLib::Vertex> *local_20;
  ListNode<MeshLib::Vertex> *n;
  ListNode<MeshLib::Vertex> *tn_local;
  List<MeshLib::Vertex> *this_local;
  
  if ((ListNode<MeshLib::Vertex> *)__filename == this->m_head) {
    ppLVar1 = ListNode<MeshLib::Vertex>::next(this->m_head);
    this->m_head = *ppLVar1;
    if (__filename != (char *)0x0) {
      operator_delete(__filename);
    }
    this->m_size = this->m_size + -1;
    pLVar2 = (ListNode<MeshLib::Vertex> *)this;
  }
  else {
    local_20 = this->m_head;
    while( true ) {
      ppLVar1 = ListNode<MeshLib::Vertex>::next(local_20);
      pLVar2 = *ppLVar1;
      if (pLVar2 == (ListNode<MeshLib::Vertex> *)__filename) break;
      ppLVar1 = ListNode<MeshLib::Vertex>::next(local_20);
      local_20 = *ppLVar1;
    }
    if (local_20 != (ListNode<MeshLib::Vertex> *)0x0) {
      ppLVar1 = ListNode<MeshLib::Vertex>::next((ListNode<MeshLib::Vertex> *)__filename);
      pLVar2 = *ppLVar1;
      ppLVar1 = ListNode<MeshLib::Vertex>::next(local_20);
      *ppLVar1 = pLVar2;
      this->m_size = this->m_size + -1;
      pLVar2 = (ListNode<MeshLib::Vertex> *)__filename;
      if (__filename != (char *)0x0) {
        operator_delete(__filename);
        pLVar2 = extraout_RAX;
      }
    }
  }
  return (int)pLVar2;
}

Assistant:

void List<T>::remove( ListNode<T> * tn )
{

	if( tn == m_head )
	{
		m_head = m_head->next();
		delete tn;
		m_size --;
		return;
	}

	ListNode<T> * n;
	n = m_head;

	while( n->next() != tn )
	{
		n = n->next();
	}


	if( n != NULL )
	{
		n->next() = tn->next();
		m_size --;
		delete tn;
	}
}